

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecVec.h
# Opt level: O0

int Vec_VecSortCompare3(Vec_Int_t **pp1,Vec_Int_t **pp2)

{
  int iVar1;
  int iVar2;
  Vec_Int_t **pp2_local;
  Vec_Int_t **pp1_local;
  
  iVar1 = Vec_IntEntry(*pp1,0);
  iVar2 = Vec_IntEntry(*pp2,0);
  if (iVar1 < iVar2) {
    pp1_local._4_4_ = -1;
  }
  else {
    iVar1 = Vec_IntEntry(*pp1,0);
    iVar2 = Vec_IntEntry(*pp2,0);
    if (iVar2 < iVar1) {
      pp1_local._4_4_ = 1;
    }
    else {
      pp1_local._4_4_ = 0;
    }
  }
  return pp1_local._4_4_;
}

Assistant:

static int Vec_VecSortCompare3( Vec_Int_t ** pp1, Vec_Int_t ** pp2 )
{
    if ( Vec_IntEntry(*pp1,0) < Vec_IntEntry(*pp2,0) )
        return -1;
    if ( Vec_IntEntry(*pp1,0) > Vec_IntEntry(*pp2,0) ) 
        return 1;
    return 0; 
}